

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O1

bool __thiscall AmpIO::GetAmpStatus(AmpIO *this,uint index)

{
  uint32_t uVar1;
  uint uVar2;
  
  if (index < this->NumMotors) {
    uVar1 = BoardIO::GetFirmwareVersion((BoardIO *)this);
    if (uVar1 < 8) {
      uVar2 = 0x100 << ((byte)index & 0x1f) & this->ReadBuffer[1];
    }
    else {
      uVar2 = this->ReadBuffer[index + this->MOTOR_STATUS_OFFSET] & 0x20000000;
    }
    return uVar2 != 0;
  }
  return false;
}

Assistant:

bool AmpIO::GetAmpStatus(unsigned int index) const
{
    if (index >= NumMotors)
        return false;

    bool ret = false;
    if (GetFirmwareVersion() < 8) {
        uint32_t mask = (0x00000100 << index);
        ret = GetStatus()&mask;
    }
    else {
        ret = ReadBuffer[MOTOR_STATUS_OFFSET + index] & MSTAT_AMP_STATUS;
    }
    return ret;
}